

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O0

bool __thiscall re2::Regexp::ParseState::DoVerticalBar(ParseState *this)

{
  Regexp *this_00;
  Regexp *this_01;
  Regexp *this_02;
  bool bVar1;
  RegexpOp RVar2;
  Regexp *r3;
  Regexp *r2;
  Regexp *r1;
  ParseState *this_local;
  
  MaybeConcatString(this,-1,NoParseFlags);
  DoConcatenation(this);
  this_00 = this->stacktop_;
  if (((this_00 == (Regexp *)0x0) || (this_01 = this_00->down_, this_01 == (Regexp *)0x0)) ||
     (RVar2 = Regexp::op(this_01), RVar2 != (kRegexpCharClass|kRegexpLiteral))) {
    bVar1 = PushSimpleOp(this,kRegexpCharClass|kRegexpLiteral);
    return bVar1;
  }
  this_02 = this_01->down_;
  if ((this_02 != (Regexp *)0x0) &&
     ((RVar2 = Regexp::op(this_00), RVar2 == kRegexpAnyChar ||
      (RVar2 = Regexp::op(this_02), RVar2 == kRegexpAnyChar)))) {
    RVar2 = Regexp::op(this_02);
    if ((RVar2 == kRegexpAnyChar) &&
       (((RVar2 = Regexp::op(this_00), RVar2 == kRegexpLiteral ||
         (RVar2 = Regexp::op(this_00), RVar2 == kRegexpCharClass)) ||
        (RVar2 = Regexp::op(this_00), RVar2 == kRegexpAnyChar)))) {
      this->stacktop_ = this_01;
      Decref(this_00);
      return true;
    }
    RVar2 = Regexp::op(this_00);
    if ((RVar2 == kRegexpAnyChar) &&
       (((RVar2 = Regexp::op(this_02), RVar2 == kRegexpLiteral ||
         (RVar2 = Regexp::op(this_02), RVar2 == kRegexpCharClass)) ||
        (RVar2 = Regexp::op(this_02), RVar2 == kRegexpAnyChar)))) {
      this_00->down_ = this_02->down_;
      this_01->down_ = this_00;
      this->stacktop_ = this_01;
      Decref(this_02);
      return true;
    }
  }
  this_00->down_ = this_01->down_;
  this_01->down_ = this_00;
  this->stacktop_ = this_01;
  return true;
}

Assistant:

bool Regexp::ParseState::DoVerticalBar() {
  MaybeConcatString(-1, NoParseFlags);
  DoConcatenation();

  // Below the vertical bar is a list to alternate.
  // Above the vertical bar is a list to concatenate.
  // We just did the concatenation, so either swap
  // the result below the vertical bar or push a new
  // vertical bar on the stack.
  Regexp* r1;
  Regexp* r2;
  if ((r1 = stacktop_) != NULL &&
      (r2 = r1->down_) != NULL &&
      r2->op() == kVerticalBar) {
    Regexp* r3;
    if ((r3 = r2->down_) != NULL &&
        (r1->op() == kRegexpAnyChar || r3->op() == kRegexpAnyChar)) {
      // AnyChar is above or below the vertical bar. Let it subsume
      // the other when the other is Literal, CharClass or AnyChar.
      if (r3->op() == kRegexpAnyChar &&
          (r1->op() == kRegexpLiteral ||
           r1->op() == kRegexpCharClass ||
           r1->op() == kRegexpAnyChar)) {
        // Discard r1.
        stacktop_ = r2;
        r1->Decref();
        return true;
      }
      if (r1->op() == kRegexpAnyChar &&
          (r3->op() == kRegexpLiteral ||
           r3->op() == kRegexpCharClass ||
           r3->op() == kRegexpAnyChar)) {
        // Rearrange the stack and discard r3.
        r1->down_ = r3->down_;
        r2->down_ = r1;
        stacktop_ = r2;
        r3->Decref();
        return true;
      }
    }
    // Swap r1 below vertical bar (r2).
    r1->down_ = r2->down_;
    r2->down_ = r1;
    stacktop_ = r2;
    return true;
  }
  return PushSimpleOp(kVerticalBar);
}